

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitIO.cpp
# Opt level: O0

bool __thiscall BitOutStream::zeroByteEnd(BitOutStream *this)

{
  uchar uVar1;
  Parameters<unsigned_char,_(unsigned_short)8> *parameters;
  size_type size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  
  data = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11e3c7);
  parameters = (Parameters<unsigned_char,_(unsigned_short)8> *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11e3d0);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  CRC::CRC_8();
  uVar1 = CRC::Calculate<unsigned_char,(unsigned_short)8>(data,size,parameters);
  if (uVar1 == '\0') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11e416);
    *(undefined4 *)
     &in_RDI[4].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = 0xffffffff;
  }
  return uVar1 == '\0';
}

Assistant:

bool BitOutStream::zeroByteEnd(){
    //remove the trailing 1 added during encoding to not have a zero byte crc
    out.data.pop_back();
    if (CRC::Calculate(out.data.data(), out.data.size() * sizeof(char), CRC::CRC_8()) != 0){
        return false;
    } else {
        // remove the bytecount and set nBitsDone to -1, indicating that the decoding is done
        out.data.pop_back();
        nBitsDone = -1;
        return true;
    }
}